

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClassType::inheritMembers
          (ClassType *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  SyntaxNode *pSVar1;
  ExtendsClauseSyntax *extendsClause;
  ImplementsClauseSyntax *implementsClause;
  ASTContext local_58;
  
  pSVar1 = (this->super_Type).super_Symbol.originatingSyntax;
  local_58.scope.ptr = &this->super_Scope;
  local_58.lookupIndex = this->headerIndex;
  local_58.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_58.flags.m_bits = 0;
  local_58.instanceOrProc = (Symbol *)0x0;
  local_58.firstTempVar = (TempVarSymbol *)0x0;
  local_58.randomizeDetails = (RandomizeDetails *)0x0;
  extendsClause = *(ExtendsClauseSyntax **)(pSVar1 + 6);
  if (extendsClause != (ExtendsClauseSyntax *)0x0) {
    handleExtends(this,extendsClause,&local_58,insertCB);
  }
  implementsClause = (ImplementsClauseSyntax *)pSVar1[6].parent;
  if (implementsClause != (ImplementsClauseSyntax *)0x0) {
    handleImplements(this,implementsClause,&local_58,insertCB);
  }
  return;
}

Assistant:

void ClassType::inheritMembers(function_ref<void(const Symbol&)> insertCB) const {
    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (classSyntax.extendsClause)
        handleExtends(*classSyntax.extendsClause, context, insertCB);

    if (classSyntax.implementsClause)
        handleImplements(*classSyntax.implementsClause, context, insertCB);
}